

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O1

int serial_initialize(void)

{
  int iVar1;
  
  iVar1 = plugin_manager_initialize
                    (&serial_manager,"serial","SERIAL_LIBRARY_PATH","/usr/local/lib",0,0);
  return iVar1;
}

Assistant:

int serial_initialize(void)
{
	return plugin_manager_initialize(
		&serial_manager,
		SERIAL_MANAGER_NAME,
		SERIAL_LIBRARY_PATH,
#if defined(SERIAL_LIBRARY_INSTALL_PATH)
		SERIAL_LIBRARY_INSTALL_PATH,
#else
		SERIAL_LIBRARY_DEFAULT_PATH,
#endif /* SERIAL_LIBRARY_INSTALL_PATH */
		NULL,
		NULL);
}